

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj_loader.cpp
# Opt level: O1

shared_ptr<embree::Texture> __thiscall
embree::OBJLoader::loadTexture(OBJLoader *this,FileName *fname)

{
  size_type *this_00;
  pointer pcVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  iterator iVar3;
  mapped_type *pmVar4;
  FileName *in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  shared_ptr<embree::Texture> sVar6;
  key_type local_50;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var5;
  
  this_00 = &fname[9].filename._M_string_length;
  pcVar1 = (in_RDX->filename)._M_dataplus._M_p;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,pcVar1,pcVar1 + (in_RDX->filename)._M_string_length);
  iVar3 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<embree::Texture>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<embree::Texture>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<embree::Texture>_>_>_>
          ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<embree::Texture>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<embree::Texture>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<embree::Texture>_>_>_>
                  *)this_00,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  if (iVar3._M_node == (_Base_ptr)&fname[9].filename.field_2) {
    FileName::operator+((FileName *)&local_50,(FileName *)&(fname->filename)._M_string_length,in_RDX
                       );
    sVar6 = Texture::load((Texture *)this,(FileName *)&local_50);
    _Var5 = sVar6.super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p == &local_50.field_2) goto LAB_00141044;
  }
  else {
    pcVar1 = (in_RDX->filename)._M_dataplus._M_p;
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_50,pcVar1,pcVar1 + (in_RDX->filename)._M_string_length);
    pmVar4 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<embree::Texture>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<embree::Texture>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<embree::Texture>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<embree::Texture>_>_>_>
                           *)this_00,&local_50);
    (this->group).ptr =
         (GroupNode *)
         (pmVar4->super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    p_Var2 = (pmVar4->super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
             _M_pi;
    (this->path).filename._M_dataplus._M_p = (pointer)p_Var2;
    if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
      }
    }
    _Var5._M_pi = extraout_RDX;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p == &local_50.field_2) goto LAB_00141044;
  }
  operator_delete(local_50._M_dataplus._M_p);
  _Var5._M_pi = extraout_RDX_00;
LAB_00141044:
  sVar6.super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var5._M_pi;
  sVar6.super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<embree::Texture>)
         sVar6.super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Texture> OBJLoader::loadTexture(const FileName& fname)
  {
    if (textureMap.find(fname.str()) != textureMap.end())
      return textureMap[fname.str()];
    
    return std::shared_ptr<Texture>(Texture::load(path+fname));
  }